

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O2

bool rgbcx::unpack_bc3(void *pBlock_bits,void *pPixels,bc1_approx_mode mode)

{
  bool bVar1;
  
  bVar1 = unpack_bc1((void *)((long)pBlock_bits + 8),pPixels,true,mode);
  unpack_bc4(pBlock_bits,(uint8_t *)((long)pPixels + 3),4);
  return !bVar1;
}

Assistant:

bool unpack_bc3(const void* pBlock_bits, void* pPixels, bc1_approx_mode mode)
	{
		color32* pDst_pixels = static_cast<color32*>(pPixels);

		bool success = true;

		if (unpack_bc1((const uint8_t*)pBlock_bits + sizeof(bc4_block), pDst_pixels, true, mode))
			success = false;

		unpack_bc4(pBlock_bits, &pDst_pixels[0].a, sizeof(color32));

		return success;
	}